

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::JsonValueHandler::encode
          (JsonValueHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  Reader input_00;
  Builder output_00;
  Builder *value;
  Builder local_70;
  Reader local_48;
  JsonCodec *local_18;
  JsonCodec *codec_local;
  JsonValueHandler *this_local;
  
  local_18 = codec;
  codec_local = (JsonCodec *)this;
  DynamicStruct::Reader::operator_cast_to_Reader(&local_48,&input);
  value = kj::mv<capnp::json::Value::Builder>(&output);
  AnyStruct::Builder::Builder<capnp::json::Value::Builder,void>(&local_70,value);
  input_00._reader.capTable = local_48._reader.capTable;
  input_00._reader.segment = local_48._reader.segment;
  input_00._reader.data = local_48._reader.data;
  input_00._reader.pointers = local_48._reader.pointers;
  input_00._reader.dataSize = local_48._reader.dataSize;
  input_00._reader.pointerCount = local_48._reader.pointerCount;
  input_00._reader._38_2_ = local_48._reader._38_2_;
  input_00._reader.nestingLimit = local_48._reader.nestingLimit;
  input_00._reader._44_4_ = local_48._reader._44_4_;
  output_00._builder.capTable = local_70._builder.capTable;
  output_00._builder.segment = local_70._builder.segment;
  output_00._builder.data = local_70._builder.data;
  output_00._builder.pointers = local_70._builder.pointers;
  output_00._builder.dataSize = local_70._builder.dataSize;
  output_00._builder.pointerCount = local_70._builder.pointerCount;
  output_00._builder._38_2_ = local_70._builder._38_2_;
  rawCopy(this,input_00,output_00);
  return;
}

Assistant:

void encode(const JsonCodec& codec, DynamicStruct::Reader input,
              JsonValue::Builder output) const override {
#if _MSC_VER
    // TODO(msvc): Hack to work around missing AnyStruct::Builder constructor on MSVC.
    rawCopy(input, toDynamic(output));
#else
    rawCopy(input, kj::mv(output));
#endif
  }